

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

char * __thiscall leveldb::Arena::Allocate(Arena *this,size_t bytes)

{
  char *pcVar1;
  
  if (bytes <= this->alloc_bytes_remaining_) {
    pcVar1 = this->alloc_ptr_;
    this->alloc_ptr_ = pcVar1 + bytes;
    this->alloc_bytes_remaining_ = this->alloc_bytes_remaining_ - bytes;
    return pcVar1;
  }
  if (0x400 < bytes) {
    pcVar1 = AllocateNewBlock(this,bytes);
    return pcVar1;
  }
  pcVar1 = AllocateNewBlock(this,0x1000);
  this->alloc_ptr_ = pcVar1 + bytes;
  this->alloc_bytes_remaining_ = 0x1000 - bytes;
  return pcVar1;
}

Assistant:

inline char* Arena::Allocate(size_t bytes) {
  // The semantics of what to return are a bit messy if we allow
  // 0-byte allocations, so we disallow them here (we don't need
  // them for our internal use).
  assert(bytes > 0);
  if (bytes <= alloc_bytes_remaining_) {
    char* result = alloc_ptr_;
    alloc_ptr_ += bytes;
    alloc_bytes_remaining_ -= bytes;
    return result;
  }
  return AllocateFallback(bytes);
}